

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

void AxCPU(CUPDLPwork *w,cupdlp_float *ax,cupdlp_float *x)

{
  CUPDLPproblem *pCVar1;
  long in_RDX;
  cupdlp_float *in_RSI;
  CUPDLPwork *in_RDI;
  cupdlp_int iCol;
  CUPDLPproblem *lp;
  int local_24;
  
  pCVar1 = in_RDI->problem;
  memset(in_RSI,0,(long)pCVar1->data->nRows << 3);
  for (local_24 = 0; local_24 < pCVar1->data->nCols; local_24 = local_24 + 1) {
    ScatterCol(in_RDI,local_24,*(cupdlp_float *)(in_RDX + (long)local_24 * 8),in_RSI);
  }
  return;
}

Assistant:

void AxCPU(CUPDLPwork *w, cupdlp_float *ax, const cupdlp_float *x) {
  // #if PDHG_USE_TIMERS
  //     ++w->timers->nAxCalls;
  //     cupdlp_float dStartTime = getTimeStamp();
  // #endif

  CUPDLPproblem *lp = w->problem;

  /* no indentity currently

  FILL_ZERO(ax, lp->data->nRows);

  // [A I]*x
  for (cupdlp_int iSeq = ncols, iRow = 0; iSeq < lp->nSeq; ++iSeq, ++iRow)
  {
      if ((pdhg->lower[iSeq] > -INFINITY) && (pdhg->upper[iSeq] < INFINITY))
      {
          ax[iRow] = scaling->rowScale ? scaling->rowScale[iRow] * x[iSeq] :
  x[iSeq];
      }
      else
      {
          ax[iRow] = 0.0;
      }
  }
  */

  memset(ax, 0, sizeof(cupdlp_float) * lp->data->nRows);

  for (cupdlp_int iCol = 0; iCol < lp->data->nCols; ++iCol) {
    ScatterCol(w, iCol, x[iCol], ax);
  }

  // #if PDHG_USE_TIMERS
  //     w->timers->dAxTime += getTimeStamp() - dStartTime;
  // #endif
}